

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_fini.c
# Opt level: O2

void mpt_connection_close(mpt_connection *con)

{
  mpt_stream *stream;
  mpt_metatype *pmVar1;
  
  if ((con->out).sock._id < 0) {
    stream = (mpt_stream *)(con->out).buf._buf;
    if (stream != (mpt_stream *)0x0) {
      mpt_stream_close(stream);
    }
  }
  else {
    mpt_outdata_close(&con->out);
  }
  con->cid = 0;
  mpt_command_clear(&con->_wait);
  pmVar1 = con->_rctx;
  if (pmVar1 != (mpt_metatype *)0x0) {
    (*pmVar1->_vptr->unref)(pmVar1);
    con->_rctx = (mpt_metatype *)0x0;
  }
  return;
}

Assistant:

extern void mpt_connection_close(MPT_STRUCT(connection) *con)
{
	MPT_STRUCT(buffer) *buf;
	MPT_INTERFACE(metatype) *rc;
	
	if (MPT_socket_active(&con->out.sock)) {
		mpt_outdata_close(&con->out);
	}
	else if ((buf = con->out.buf._buf)) {
		mpt_stream_close((void *) buf);
	}
	con->cid = 0;
	mpt_command_clear(&con->_wait);
	
	if ((rc = con->_rctx)) {
		rc->_vptr->unref(rc);
		con->_rctx = 0;
	}
}